

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O2

bool __thiscall sentencepiece::SentencePieceText::IsInitialized(SentencePieceText *this)

{
  bool bVar1;
  
  bVar1 = google::protobuf::internal::ExtensionSet::IsInitialized(&this->_extensions_);
  if (bVar1) {
    bVar1 = google::protobuf::internal::
            AllAreInitialized<sentencepiece::SentencePieceText_SentencePiece>(&this->pieces_);
    return bVar1;
  }
  return false;
}

Assistant:

bool SentencePieceText::IsInitialized() const {
  if (!_extensions_.IsInitialized()) {
    return false;
  }

  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(pieces_)) return false;
  return true;
}